

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_pdqsort.hpp
# Opt level: O2

void duckdb_pdqsort::insertion_sort(PDQIterator *begin,PDQIterator *end,PDQConstants *constants)

{
  idx_t *piVar1;
  bool bVar2;
  idx_t iVar3;
  data_ptr_t *l;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  PDQIterator sift_1;
  data_ptr_t local_70;
  idx_t *local_68;
  PDQIterator *local_60;
  data_ptr_t local_58;
  data_ptr_t local_50;
  idx_t *local_48;
  data_ptr_t local_40;
  idx_t *local_38;
  
  pdVar4 = end->ptr;
  if (begin->ptr != pdVar4) {
    piVar1 = begin->entry_size;
    iVar3 = *piVar1;
    local_60 = end;
    for (pdVar5 = begin->ptr + iVar3; pdVar5 != pdVar4; pdVar5 = pdVar5 + iVar3) {
      pdVar4 = pdVar5 + -iVar3;
      local_70 = pdVar5;
      local_68 = piVar1;
      local_50 = pdVar4;
      local_48 = piVar1;
      bVar2 = comp(&local_70,&local_50,constants);
      if (bVar2) {
        l = GET_TMP(&local_70,constants);
        local_58 = pdVar5;
        do {
          pdVar6 = pdVar5 + -*piVar1;
          local_40 = pdVar5;
          local_38 = piVar1;
          MOVE(&local_40,&local_50,constants);
          if (pdVar6 == begin->ptr) break;
          pdVar4 = pdVar4 + -*piVar1;
          local_50 = pdVar4;
          bVar2 = comp(l,&local_50,constants);
          pdVar5 = pdVar6;
        } while (bVar2);
        local_70 = pdVar6;
        MOVE(&local_70,l,constants);
        end = local_60;
        pdVar5 = local_58;
      }
      iVar3 = *piVar1;
      pdVar4 = end->ptr;
    }
  }
  return;
}

Assistant:

inline void insertion_sort(const PDQIterator &begin, const PDQIterator &end, const PDQConstants &constants) {
	if (begin == end) {
		return;
	}

	for (PDQIterator cur = begin + 1; cur != end; ++cur) {
		PDQIterator sift = cur;
		PDQIterator sift_1 = cur - 1;

		// Compare first so we can avoid 2 moves for an element already positioned correctly.
		if (comp(*sift, *sift_1, constants)) {
			const auto &tmp = GET_TMP(*sift, constants);

			do {
				MOVE(*sift--, *sift_1, constants);
			} while (sift != begin && comp(tmp, *--sift_1, constants));

			MOVE(*sift, tmp, constants);
		}
	}
}